

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

char * bstr2cstr(const_bstring b,char z)

{
  uchar *puVar1;
  char *pcVar2;
  long lVar3;
  uchar uVar4;
  long lVar5;
  
  if (b == (const_bstring)0x0) {
    return (char *)0x0;
  }
  lVar5 = (long)b->slen;
  if (((-1 < lVar5) && (puVar1 = b->data, puVar1 != (uchar *)0x0)) &&
     (pcVar2 = (char *)malloc(lVar5 + 1), pcVar2 != (char *)0x0)) {
    for (lVar3 = 0; lVar5 != lVar3; lVar3 = lVar3 + 1) {
      uVar4 = puVar1[lVar3];
      if (uVar4 == '\0') {
        uVar4 = z;
      }
      pcVar2[lVar3] = uVar4;
    }
    pcVar2[lVar5] = '\0';
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

char * bstr2cstr (const_bstring b, char z) {
int i, l;
char * r;

	if (b == NULL || b->slen < 0 || b->data == NULL) return NULL;
	l = b->slen;
	r = (char *) bstr__alloc ((size_t)l + 1);
	if (r == NULL) return r;

	for (i=0; i < l; i ++) {
		r[i] = (char) ((b->data[i] == '\0') ? z : (char) (b->data[i]));
	}

	r[l] = (unsigned char) '\0';

	return r;
}